

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O0

bool comparesEqual(QJsonArray *lhs,QJsonArray *rhs)

{
  long lVar1;
  bool bVar2;
  QCborContainerPrivate *pQVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  qsizetype i;
  QCborValue *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  byte in_stack_ffffffffffffff87;
  QCborContainerPrivate *in_stack_ffffffffffffff98;
  long local_58;
  bool local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = operator==((QExplicitlySharedDataPointer<QCborContainerPrivate> *)
                     CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                     (QExplicitlySharedDataPointer<QCborContainerPrivate> *)
                     in_stack_ffffffffffffff78);
  if (bVar2) {
    local_39 = true;
  }
  else {
    bVar2 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                      ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48767f);
    if (bVar2) {
      pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48768f);
      qVar4 = QList<QtCbor::Element>::size(&pQVar3->elements);
      local_39 = (bool)((qVar4 != 0 ^ 0xffU) & 1);
    }
    else {
      bVar2 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                        ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x4876b9);
      if (bVar2) {
        pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x4876c9);
        qVar4 = QList<QtCbor::Element>::size(&pQVar3->elements);
        local_39 = (bool)((qVar4 != 0 ^ 0xffU) & 1);
      }
      else {
        pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x4876f3);
        qVar4 = QList<QtCbor::Element>::size(&pQVar3->elements);
        pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48770e);
        qVar5 = QList<QtCbor::Element>::size(&pQVar3->elements);
        if (qVar4 == qVar5) {
          local_58 = 0;
          while( true ) {
            pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                               ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48774e);
            qVar5 = QList<QtCbor::Element>::size(&pQVar3->elements);
            if (qVar5 <= local_58) break;
            QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                      ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x487775);
            QCborContainerPrivate::valueAt(in_stack_ffffffffffffff98,qVar4);
            QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                      ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x487791);
            QCborContainerPrivate::valueAt(in_stack_ffffffffffffff98,qVar4);
            in_stack_ffffffffffffff87 =
                 operator!=((QCborValue *)
                            CONCAT17(in_stack_ffffffffffffff87,
                                     CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                            in_stack_ffffffffffffff78);
            QCborValue::~QCborValue
                      ((QCborValue *)
                       CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
            QCborValue::~QCborValue
                      ((QCborValue *)
                       CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
            if ((in_stack_ffffffffffffff87 & 1) != 0) {
              local_39 = false;
              goto LAB_00487815;
            }
            local_58 = local_58 + 1;
          }
          local_39 = true;
        }
        else {
          local_39 = false;
        }
      }
    }
  }
LAB_00487815:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool comparesEqual(const QJsonArray &lhs, const QJsonArray &rhs)
{
    if (lhs.a == rhs.a)
        return true;

    if (!lhs.a)
        return !rhs.a->elements.size();
    if (!rhs.a)
        return !lhs.a->elements.size();
    if (lhs.a->elements.size() != rhs.a->elements.size())
        return false;

    for (qsizetype i = 0; i < lhs.a->elements.size(); ++i) {
        if (lhs.a->valueAt(i) != rhs.a->valueAt(i))
            return false;
    }
    return true;
}